

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_neg_not(ASMState *as,IRIns *ir,x86Group3 xg)

{
  Reg r2;
  int iVar1;
  Reg dest;
  x86Group3 xg_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  r2 = ra_dest(as,ir,0xbfef);
  iVar1 = 0;
  if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
    iVar1 = 0x80200;
  }
  emit_rr(as,XO_GROUP3,xg + iVar1,r2);
  ra_left(as,r2,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_neg_not(ASMState *as, IRIns *ir, x86Group3 xg)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  emit_rr(as, XO_GROUP3, REX_64IR(ir, xg), dest);
  ra_left(as, dest, ir->op1);
}